

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::COBImporter::ReadCame_Ascii
          (COBImporter *this,Scene *out,LineSplitter *splitter,ChunkInfo *nfo)

{
  uint uVar1;
  Camera *this_00;
  __shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *msh_00;
  LineSplitter *splitter_00;
  Camera *msh;
  shared_ptr<Assimp::COB::Camera> local_48;
  shared_ptr<Assimp::COB::Node> local_38;
  ChunkInfo *local_28;
  ChunkInfo *nfo_local;
  LineSplitter *splitter_local;
  Scene *out_local;
  COBImporter *this_local;
  
  local_28 = nfo;
  nfo_local = (ChunkInfo *)splitter;
  splitter_local = (LineSplitter *)out;
  out_local = (Scene *)this;
  if (nfo->version < 3) {
    this_00 = (Camera *)operator_new(0xd8);
    COB::Camera::Camera(this_00);
    std::shared_ptr<Assimp::COB::Camera>::shared_ptr<Assimp::COB::Camera,void>(&local_48,this_00);
    std::shared_ptr<Assimp::COB::Node>::shared_ptr<Assimp::COB::Camera,void>(&local_38,&local_48);
    std::
    deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
    ::push_back(&out->nodes,&local_38);
    std::shared_ptr<Assimp::COB::Node>::~shared_ptr(&local_38);
    std::shared_ptr<Assimp::COB::Camera>::~shared_ptr(&local_48);
    this_01 = &std::
               deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
               ::back((deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                       *)splitter_local)->
               super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>;
    msh_00 = std::__shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>::get(this_01);
    uVar1 = local_28->parent_id;
    (msh_00->super_ChunkInfo).id = local_28->id;
    (msh_00->super_ChunkInfo).parent_id = uVar1;
    uVar1 = local_28->size;
    (msh_00->super_ChunkInfo).version = local_28->version;
    (msh_00->super_ChunkInfo).size = uVar1;
    splitter_00 = LineSplitter::operator++((LineSplitter *)nfo_local);
    ReadBasicNodeInfo_Ascii(this,msh_00,splitter_00,local_28);
    LineSplitter::operator++((LineSplitter *)nfo_local);
  }
  else {
    UnsupportedChunk_Ascii(this,splitter,nfo,"Came");
  }
  return;
}

Assistant:

void COBImporter::ReadCame_Ascii(Scene& out, LineSplitter& splitter, const ChunkInfo& nfo)
{
    if(nfo.version > 2) {
        return UnsupportedChunk_Ascii(splitter,nfo,"Came");
    }

    out.nodes.push_back(std::shared_ptr<Camera>(new Camera()));
    Camera& msh = (Camera&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Ascii(msh,++splitter,nfo);

    // skip the next line, we don't know this differenciation between a
    // standard camera and a panoramic camera.
    ++splitter;
}